

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O1

void __thiscall
QAbstractScrollAreaPrivate::layoutChildren_helper
          (QAbstractScrollAreaPrivate *this,bool *needHorizontalScrollbar,
          bool *needVerticalScrollbar)

{
  ScrollBarPolicy SVar1;
  QWidget *widget;
  QWidgetData *pQVar2;
  QWidget *pQVar3;
  QHeaderView *this_00;
  QAbstractScrollAreaScrollBarContainer *pQVar4;
  Representation RVar5;
  undefined8 uVar6;
  Representation RVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  Representation RVar18;
  Orientation OVar19;
  LayoutDirection LVar20;
  QStyle *pQVar21;
  undefined8 uVar22;
  int extraout_var;
  bool bVar23;
  int iVar24;
  Representation RVar25;
  long lVar26;
  Representation RVar27;
  undefined8 uVar28;
  bool bVar29;
  undefined8 *puVar30;
  QRect *pQVar31;
  QStyleOptionSlider *pQVar32;
  long lVar33;
  Representation RVar34;
  long in_FS_OFFSET;
  bool bVar35;
  Representation RVar36;
  Representation RVar37;
  QRect QVar38;
  QRect QVar39;
  QList<QHeaderView_*> list;
  QStyleOption opt;
  QStyleOptionSlider barOpt;
  Representation local_188;
  Representation local_180;
  QRect local_148;
  ulong local_138;
  QRect local_128;
  QRect local_118;
  QRect local_108;
  undefined1 local_f8 [12];
  LayoutDirection LStack_ec;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  QPalettePrivate *pQStack_d0;
  undefined1 *local_c8;
  QObject *pQStack_c0;
  QStyleOptionSlider local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  widget = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  puVar30 = &DAT_00681398;
  pQVar32 = &local_b8;
  for (lVar26 = 0x10; lVar26 != 0; lVar26 = lVar26 + -1) {
    uVar22 = *puVar30;
    (pQVar32->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar22;
    (pQVar32->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar22 >> 0x20);
    puVar30 = puVar30 + 1;
    pQVar32 = (QStyleOptionSlider *)&(pQVar32->super_QStyleOptionComplex).super_QStyleOption.state;
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b8);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->hbar,&local_b8);
  pQVar21 = QWidget::style((QWidget *)this->hbar);
  iVar10 = (**(code **)(*(long *)pQVar21 + 0xf0))(pQVar21,0x60,&local_b8,this->hbar,0);
  bVar29 = true;
  bVar23 = true;
  if (*needHorizontalScrollbar == false) {
    SVar1 = this->hbarpolicy;
    if (SVar1 == ScrollBarAlwaysOff) {
LAB_00391f9f:
      bVar23 = false;
    }
    else if ((SVar1 != ScrollBarAlwaysOn) || (bVar23 = true, iVar10 != 0)) {
      if (iVar10 == 0 && SVar1 != ScrollBarAsNeeded) goto LAB_00391f9f;
      iVar11 = QAbstractSlider::minimum(&this->hbar->super_QAbstractSlider);
      iVar12 = QAbstractSlider::maximum(&this->hbar->super_QAbstractSlider);
      if (iVar11 < iVar12) {
        uVar22 = (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x70))()
        ;
        bVar23 = 0 < (int)((ulong)uVar22 >> 0x20) && 0 < (int)uVar22;
      }
      else {
        bVar23 = false;
      }
    }
  }
  pQVar21 = QWidget::style((QWidget *)this->hbar);
  iVar11 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x56,&local_b8,this->hbar);
  (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x1a8))
            (this->vbar,&local_b8);
  pQVar21 = QWidget::style((QWidget *)this->vbar);
  iVar12 = (**(code **)(*(long *)pQVar21 + 0xf0))(pQVar21,0x60,&local_b8,this->vbar,0);
  if (*needVerticalScrollbar == false) {
    SVar1 = this->vbarpolicy;
    if (SVar1 != ScrollBarAlwaysOff) {
      if ((SVar1 == ScrollBarAlwaysOn) && (iVar12 == 0)) goto LAB_003920e6;
      if (iVar12 != 0 || SVar1 == ScrollBarAsNeeded) {
        iVar13 = QAbstractSlider::minimum(&this->vbar->super_QAbstractSlider);
        iVar14 = QAbstractSlider::maximum(&this->vbar->super_QAbstractSlider);
        if (iVar13 < iVar14) {
          uVar22 = (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x70))
                             ();
          bVar29 = 0 < (int)((ulong)uVar22 >> 0x20) && 0 < (int)uVar22;
          goto LAB_003920e6;
        }
      }
    }
    bVar29 = false;
  }
LAB_003920e6:
  pQVar21 = QWidget::style((QWidget *)this->vbar);
  iVar14 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x56,&local_b8,this->vbar);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_c0 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffff10 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption((QStyleOption *)local_f8,0,0);
  QStyleOption::initFrom((QStyleOption *)local_f8,widget);
  (**(code **)(*(long *)&(this->hbar->super_QAbstractSlider).super_QWidget + 0x70))();
  iVar15 = (**(code **)(*(long *)&(this->vbar->super_QAbstractSlider).super_QWidget + 0x70))();
  pQVar2 = widget->data;
  local_108.x2.m_i = (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i;
  local_108.y2.m_i = (pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i;
  local_108.x1.m_i = 0;
  local_108.y1.m_i = 0;
  pQVar3 = this->cornerWidget;
  bVar8 = iVar14 == 0 & bVar29;
  iVar13 = 0;
  if (bVar8 != 0) {
    iVar13 = iVar15;
  }
  bVar9 = iVar11 == 0 & bVar23;
  iVar17 = 0;
  if (bVar9 != 0) {
    iVar17 = extraout_var;
  }
  local_118 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  if ((this->super_QFramePrivate).frameStyle == 0) {
LAB_00392359:
    local_148 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_108);
    QFrame::setFrameRect((QFrame *)widget,&local_148);
    QVar39 = QWidget::contentsRect(widget);
    uVar22 = QVar39._0_8_;
    local_118.x2.m_i = QVar39.x2.m_i.m_i - iVar13;
    local_118.x1.m_i = (int)uVar22;
    local_118.y1.m_i = SUB84(uVar22,4);
    local_118.y2.m_i = QVar39.y2.m_i.m_i - iVar17;
  }
  else {
    pQVar21 = QWidget::style(widget);
    iVar16 = (**(code **)(*(long *)pQVar21 + 0xf0))(pQVar21,0x11,local_f8,widget,0);
    uVar22 = local_108._0_8_;
    if (iVar16 == 0) goto LAB_00392359;
    QVar39.x2.m_i = local_108.x2.m_i;
    QVar39.y2.m_i = local_108.y2.m_i;
    QVar39.x1.m_i = local_108.x1.m_i;
    QVar39.y1.m_i = local_108.y1.m_i;
    pQVar21 = QWidget::style(widget);
    iVar16 = (**(code **)(*(long *)pQVar21 + 0xe0))(pQVar21,0x55,local_f8,widget);
    iVar24 = iVar14 + iVar16;
    if (bVar29 == false) {
      iVar24 = 0;
    }
    iVar16 = iVar16 + iVar11;
    if (bVar23 == false) {
      iVar16 = 0;
    }
    local_148.x2.m_i = local_108.x2.m_i;
    local_148.y2.m_i = local_108.y2.m_i;
    local_148.x2.m_i = local_148.x2.m_i - (iVar24 + iVar13);
    local_148.x1.m_i = local_108.x1.m_i;
    local_148.y1.m_i = local_108.y1.m_i;
    local_148.y2.m_i = local_148.y2.m_i - (iVar16 + iVar17);
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    QFrame::setFrameRect((QFrame *)widget,&local_128);
    LVar20 = LStack_ec;
    local_128 = QWidget::contentsRect(widget);
    local_118 = QStyle::visualRect(LVar20,(QRect *)&local_e8,&local_128);
  }
  bVar35 = pQVar3 != (QWidget *)0x0;
  iVar17 = 0;
  iVar13 = 0;
  if (bVar29 != false) {
    iVar13 = iVar15;
  }
  if (bVar23 != false) {
    iVar17 = extraout_var;
  }
  if (((bVar9 | bVar8) & bVar35) != 0) {
    iVar17 = extraout_var;
    iVar13 = iVar15;
  }
  RVar34 = QVar39.x2.m_i;
  RVar25.m_i = (RVar34.m_i - iVar13) + 1;
  RVar27 = QVar39.y2.m_i;
  RVar18.m_i = (RVar27.m_i - iVar17) + 1;
  if (((bVar23 & bVar29) == 1) && ((iVar14 == 0 && iVar11 == 0) && pQVar3 == (QWidget *)0x0)) {
    local_148.y1.m_i = RVar18.m_i;
    local_148.x1.m_i = RVar25.m_i;
    local_148.x2.m_i = iVar15 + (RVar34.m_i - iVar13);
    local_148.y2.m_i = (RVar27.m_i - iVar17) + extraout_var;
    QVar38 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    this->cornerPaintingRect = QVar38;
  }
  else {
    (this->cornerPaintingRect).x1 = 0;
    (this->cornerPaintingRect).y1 = 0;
    (this->cornerPaintingRect).x2 = -1;
    (this->cornerPaintingRect).y2 = -1;
  }
  if ((bVar29 & 0 < iVar14) == 0) {
    RVar5.m_i = 0;
    iVar14 = 0;
    if ((0 < iVar11 & bVar23) == 0) goto LAB_00392683;
  }
  local_148 = (QRect)ZEXT816(0);
  local_138 = 0;
  RVar5.m_i = 0;
  qt_qFindChildren_helper(widget,0,0,&QHeaderView::staticMetaObject,&local_148,1);
  if (local_138 < 3) {
    iVar14 = 0;
    if (local_138 != 0) {
      uVar6 = local_148._8_8_;
      lVar26 = local_138 << 3;
      lVar33 = 0;
      uVar28 = 0;
      RVar5.m_i = 0;
      do {
        this_00 = *(QHeaderView **)(uVar6 + lVar33);
        local_128 = ((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                     super_QWidget.data)->crect;
        OVar19 = QHeaderView::orientation(this_00);
        if ((OVar19 == Vertical) &&
           ((((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
              super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
          QVar38 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_128);
          if (((puStack_e0._0_4_ - local_e8._0_4_) -
              ((puStack_e0._0_4_ - local_e8._0_4_) + 1 >> 0x1f)) + 1 >> 1 < QVar38.x1.m_i.m_i)
          goto LAB_003925db;
          QVar38 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_128);
          uVar28 = QVar38._8_8_;
        }
        else {
LAB_003925db:
          OVar19 = QHeaderView::orientation(this_00);
          if ((OVar19 == Horizontal) &&
             ((((this_00->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                super_QWidget.data)->widget_attributes & 0x8000) != 0)) {
            RVar7.m_i = local_128.y1.m_i;
            iVar11 = QFrame::frameWidth((QFrame *)widget);
            if (RVar7.m_i <= iVar11) {
              RVar5.m_i = local_128.y2.m_i;
            }
          }
        }
        iVar14 = (int)uVar28;
        lVar33 = lVar33 + 8;
      } while (lVar26 != lVar33);
    }
  }
  else {
    iVar14 = 0;
  }
  if ((QArrayData *)local_148._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_148._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_148._0_8_,8,0x10);
    }
  }
LAB_00392683:
  if (bVar23 != false) {
    local_188 = QVar39.x1.m_i;
    local_148.y1.m_i = RVar18.m_i;
    local_148.x1.m_i = iVar14 + local_188.m_i;
    local_148.x2.m_i = RVar34.m_i - iVar13;
    if (iVar10 != 0 && !bVar35) {
      local_148.x2.m_i = RVar34.m_i;
    }
    local_148.y2.m_i = RVar27.m_i;
    local_148.x1.m_i = local_148.x1.m_i;
    local_148.y1.m_i = local_148.y1.m_i;
    local_148.x2.m_i = local_148.x2.m_i;
    pQVar4 = (this->scrollBarContainers).m_data[0];
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    pQVar31 = &local_128;
    QWidget::setGeometry(&pQVar4->super_QWidget,pQVar31);
    QWidget::raise(&(this->scrollBarContainers).m_data[0]->super_QWidget,(int)pQVar31);
  }
  if (bVar29 != false) {
    local_180.m_i = SUB84(uVar22,4);
    local_148.y1.m_i = RVar5.m_i + local_180.m_i;
    local_148.x1.m_i = RVar25.m_i;
    local_148.x2.m_i = RVar34.m_i;
    local_148.y2.m_i = RVar27.m_i - iVar17;
    if (iVar12 != 0 && !bVar35) {
      local_148.y2.m_i = RVar27.m_i;
    }
    pQVar4 = (this->scrollBarContainers).m_data[1];
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    pQVar31 = &local_128;
    QWidget::setGeometry(&pQVar4->super_QWidget,pQVar31);
    QWidget::raise(&(this->scrollBarContainers).m_data[1]->super_QWidget,(int)pQVar31);
  }
  pQVar3 = this->cornerWidget;
  if (pQVar3 != (QWidget *)0x0) {
    local_148.y1.m_i = RVar18.m_i;
    local_148.x1.m_i = RVar25.m_i;
    local_148.x2.m_i = RVar34.m_i;
    local_148.y2.m_i = RVar27.m_i;
    local_128 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_148);
    QWidget::setGeometry(pQVar3,&local_128);
  }
  pQVar4 = (this->scrollBarContainers).m_data[0];
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x68))(pQVar4,bVar23);
  pQVar4 = (this->scrollBarContainers).m_data[1];
  (**(code **)(*(long *)&pQVar4->super_QWidget + 0x68))(pQVar4,bVar29);
  LVar20 = QWidget::layoutDirection(widget);
  QVar39 = local_118;
  local_118.y1.m_i = local_118.y1.m_i + this->top;
  local_118.x1.m_i =
       local_118.x1.m_i +
       ((Representation *)(&this->scrollBarContainers + 5))[(ulong)(LVar20 == RightToLeft) * 2 + 2].
       m_i;
  local_118.x2 = QVar39.x2.m_i;
  local_118.y2 = QVar39.y2.m_i;
  local_118.x2.m_i =
       local_118.x2.m_i -
       ((Representation *)(&this->scrollBarContainers + 5))[(ulong)(LVar20 != RightToLeft) * 2 + 2].
       m_i;
  local_118.y2.m_i = local_118.y2.m_i - this->bottom;
  QVar39 = QStyle::visualRect(LStack_ec,(QRect *)&local_e8,&local_118);
  RVar36 = (this->overshoot).xp;
  RVar37 = (this->overshoot).yp;
  local_118.x1 = QVar39.x1.m_i;
  local_118.y1 = QVar39.y1.m_i;
  local_118.x2 = QVar39.x2.m_i;
  local_118.y2 = QVar39.y2.m_i;
  local_118.y1.m_i = local_118.y1.m_i - RVar37.m_i;
  local_118.x1.m_i = local_118.x1.m_i - RVar36.m_i;
  local_118.x2.m_i = local_118.x2.m_i - RVar36.m_i;
  local_118.y2.m_i = local_118.y2.m_i - RVar37.m_i;
  QWidget::setGeometry(this->viewport,&local_118);
  *needHorizontalScrollbar = bVar23;
  *needVerticalScrollbar = bVar29;
  QStyleOption::~QStyleOption((QStyleOption *)local_f8);
  QStyleOption::~QStyleOption((QStyleOption *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractScrollAreaPrivate::layoutChildren_helper(bool *needHorizontalScrollbar, bool *needVerticalScrollbar)
{
    Q_Q(QAbstractScrollArea);
    QStyleOptionSlider barOpt;

    hbar->initStyleOption(&barOpt);
    bool htransient = hbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, hbar);
    bool needh = *needHorizontalScrollbar || ((hbarpolicy != Qt::ScrollBarAlwaysOff) && ((hbarpolicy == Qt::ScrollBarAlwaysOn && !htransient)
                            || ((hbarpolicy == Qt::ScrollBarAsNeeded || htransient)
                            && hbar->minimum() < hbar->maximum() && !hbar->sizeHint().isEmpty())));
    const int hscrollOverlap = hbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, hbar);

    vbar->initStyleOption(&barOpt);
    bool vtransient = vbar->style()->styleHint(QStyle::SH_ScrollBar_Transient, &barOpt, vbar);
    bool needv = *needVerticalScrollbar || ((vbarpolicy != Qt::ScrollBarAlwaysOff) && ((vbarpolicy == Qt::ScrollBarAlwaysOn && !vtransient)
                            || ((vbarpolicy == Qt::ScrollBarAsNeeded || vtransient)
                            && vbar->minimum() < vbar->maximum() && !vbar->sizeHint().isEmpty())));
    const int vscrollOverlap = vbar->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, &barOpt, vbar);

    QStyleOption opt(0);
    opt.initFrom(q);

    const int hsbExt = hbar->sizeHint().height();
    const int vsbExt = vbar->sizeHint().width();
    const QPoint extPoint(vsbExt, hsbExt);
    const QSize extSize(vsbExt, hsbExt);

    const QRect widgetRect = q->rect();

    const bool hasCornerWidget = (cornerWidget != nullptr);

    QPoint cornerOffset((needv && vscrollOverlap == 0) ? vsbExt : 0, (needh && hscrollOverlap == 0) ? hsbExt : 0);
    QRect controlsRect;
    QRect viewportRect;

    // In FrameOnlyAroundContents mode the frame is drawn between the controls and
    // the viewport, else the frame rect is equal to the widget rect.
    if ((frameStyle != QFrame::NoFrame) &&
        q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, &opt, q)) {
        controlsRect = widgetRect;
        const int spacing = q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarSpacing, &opt, q);
        const QPoint cornerExtra(needv ? spacing + vscrollOverlap : 0, needh ? spacing + hscrollOverlap : 0);
        QRect frameRect = widgetRect;
        frameRect.adjust(0, 0, -cornerOffset.x() - cornerExtra.x(), -cornerOffset.y() - cornerExtra.y());
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, frameRect));
        // The frame rect needs to be in logical coords, however we need to flip
        // the contentsRect back before passing it on to the viewportRect
        // since the viewportRect has its logical coords calculated later.
        viewportRect = QStyle::visualRect(opt.direction, opt.rect, q->contentsRect());
    } else {
        q->setFrameRect(QStyle::visualRect(opt.direction, opt.rect, widgetRect));
        controlsRect = q->contentsRect();
        viewportRect = QRect(controlsRect.topLeft(), controlsRect.bottomRight() - cornerOffset);
    }

    cornerOffset = QPoint(needv ? vsbExt : 0, needh ? hsbExt : 0);

    // If we have a corner widget and are only showing one scroll bar, we need to move it
    // to make room for the corner widget.
    if (hasCornerWidget && ((needv && vscrollOverlap == 0) || (needh && hscrollOverlap == 0)))
        cornerOffset =  extPoint;

    // The corner point is where the scroll bar rects, the corner widget rect and the
    // viewport rect meets.
    const QPoint cornerPoint(controlsRect.bottomRight() + QPoint(1, 1) - cornerOffset);

    // Some styles paints the corner if both scorllbars are showing and there is
    // no corner widget.
    if (needv && needh && !hasCornerWidget && hscrollOverlap == 0 && vscrollOverlap == 0)
        cornerPaintingRect = QStyle::visualRect(opt.direction, opt.rect, QRect(cornerPoint, extSize));
    else
        cornerPaintingRect = QRect();

    // move the scrollbars away from top/left headers
    int vHeaderRight = 0;
    int hHeaderBottom = 0;
#if QT_CONFIG(itemviews)
    if ((vscrollOverlap > 0 && needv) || (hscrollOverlap > 0 && needh)) {
        const QList<QHeaderView *> headers = q->findChildren<QHeaderView*>();
        if (headers.size() <= 2) {
            for (const QHeaderView *header : headers) {
                const QRect geo = header->geometry();
                if (header->orientation() == Qt::Vertical && header->isVisible() && QStyle::visualRect(opt.direction, opt.rect, geo).left() <= opt.rect.width() / 2)
                    vHeaderRight = QStyle::visualRect(opt.direction, opt.rect, geo).right();
                else if (header->orientation() == Qt::Horizontal && header->isVisible() && geo.top() <= q->frameWidth())
                    hHeaderBottom = geo.bottom();
             }
         }
    }
#endif // QT_CONFIG(itemviews)
    if (needh) {
        QRect horizontalScrollBarRect(QPoint(controlsRect.left() + vHeaderRight, cornerPoint.y()), QPoint(cornerPoint.x() - 1, controlsRect.bottom()));

        if (!hasCornerWidget && htransient)
            horizontalScrollBarRect.adjust(0, 0, cornerOffset.x(), 0);
        scrollBarContainers[Qt::Horizontal]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, horizontalScrollBarRect));
        scrollBarContainers[Qt::Horizontal]->raise();
    }

    if (needv) {
        QRect verticalScrollBarRect  (QPoint(cornerPoint.x(), controlsRect.top() + hHeaderBottom),  QPoint(controlsRect.right(), cornerPoint.y() - 1));
        if (!hasCornerWidget && vtransient)
            verticalScrollBarRect.adjust(0, 0, 0, cornerOffset.y());
        scrollBarContainers[Qt::Vertical]->setGeometry(QStyle::visualRect(opt.direction, opt.rect, verticalScrollBarRect));
        scrollBarContainers[Qt::Vertical]->raise();
    }

    if (cornerWidget) {
        const QRect cornerWidgetRect(cornerPoint, controlsRect.bottomRight());
        cornerWidget->setGeometry(QStyle::visualRect(opt.direction, opt.rect, cornerWidgetRect));
    }

    scrollBarContainers[Qt::Horizontal]->setVisible(needh);
    scrollBarContainers[Qt::Vertical]->setVisible(needv);

    if (q->isRightToLeft())
        viewportRect.adjust(right, top, -left, -bottom);
    else
        viewportRect.adjust(left, top, -right, -bottom);
    viewportRect = QStyle::visualRect(opt.direction, opt.rect, viewportRect);
    viewportRect.translate(-overshoot);
    viewport->setGeometry(viewportRect); // resize the viewport last

    *needHorizontalScrollbar = needh;
    *needVerticalScrollbar = needv;
}